

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::findOrEmitObject(SemanticParser *this,SP *pbrtObject)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  _Base_ptr this_00;
  size_t *psVar5;
  element_type *peVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  element_type *peVar9;
  _Base_ptr in_RDX;
  element_type *peVar10;
  SemanticParser *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  undefined8 *puVar12;
  size_t *psVar13;
  bool bVar14;
  SP SVar15;
  SP *ourObject;
  SP ourShape;
  SP ourLightSource;
  undefined1 local_a0 [48];
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  size_t local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  
  peVar10 = pbrtObject[0xf].super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var1 = &pbrtObject[0xe].super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  peVar9 = (element_type *)p_Var1;
  if (peVar10 != (element_type *)0x0) {
    do {
      bVar14 = *(ulong *)((long)&(peVar10->name).field_2 + 8) < *(ulong *)in_RDX;
      if (!bVar14) {
        peVar9 = peVar10;
      }
      peVar10 = (element_type *)(&(peVar10->name)._M_string_length)[bVar14];
    } while (peVar10 != (element_type *)0x0);
  }
  peVar10 = (element_type *)p_Var1;
  if ((peVar9 != (element_type *)p_Var1) &&
     (peVar10 = peVar9, *(ulong *)in_RDX < *(ulong *)((long)&(peVar9->name).field_2 + 8))) {
    peVar10 = (element_type *)p_Var1;
  }
  if (peVar10 == (element_type *)p_Var1) {
    p_Var1 = &(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Object,std::allocator<pbrt::Object>>
              (p_Var1,(Object **)this,(allocator<pbrt::Object> *)local_a0);
    std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Object,pbrt::Object>
              ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)this,
               (Object *)
               (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_38 = (element_type *)p_Var1;
    pmVar7 = std::
             map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
             ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                           *)(pbrtObject + 0xe),(key_type *)in_RDX);
    (pmVar7->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar7->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               p_Var1);
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pixelFilter);
    puVar3 = *(undefined8 **)(*(long *)in_RDX + 0x78);
    local_60 = in_RDX;
    for (puVar12 = *(undefined8 **)(*(long *)in_RDX + 0x70); puVar12 != puVar3;
        puVar12 = puVar12 + 2) {
      p_Var4 = (_Base_ptr)*puVar12;
      this_00 = (_Base_ptr)puVar12[1];
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
        if (this_00 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          }
        }
      }
      local_70 = p_Var4;
      local_68 = this_00;
      findOrCreateLightSource((SemanticParser *)&stack0xffffffffffffffb8,(SP *)pbrtObject);
      if (local_68 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
      }
      if (local_48 == (element_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"***warning***: could ont parse light source \'",0x2d);
        (*(code *)**(undefined8 **)p_Var4)(local_a0,p_Var4);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_a0._0_8_,local_a0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,(ulong)((long)(_func_int ***)local_a0._16_8_ + 1));
        }
      }
      else {
        std::
        vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
        ::push_back((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                     *)&((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->film,(value_type *)&stack0xffffffffffffffb8);
      }
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
    }
    puVar12 = *(undefined8 **)(*(long *)local_60 + 0x28);
    puVar3 = *(undefined8 **)(*(long *)local_60 + 0x30);
    if (puVar12 != puVar3) {
      do {
        local_a0._32_8_ = *puVar12;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[1];
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
        }
        local_a0._40_8_ = p_Var2;
        findOrCreateShape((SemanticParser *)local_a0,(SP *)pbrtObject);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._40_8_);
        }
        if ((element_type *)local_a0._0_8_ != (element_type *)0x0) {
          std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                       *)&((this->result).
                           super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          cameras,(value_type *)local_a0);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        puVar12 = puVar12 + 2;
      } while (puVar12 != puVar3);
    }
    psVar13 = *(size_t **)(*(long *)local_60 + 0x58);
    psVar5 = *(size_t **)(*(long *)local_60 + 0x60);
    if (psVar13 != psVar5) {
      do {
        local_58 = *psVar13;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar13[1];
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        peVar6 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        local_50 = p_Var2;
        emitInstance((SemanticParser *)local_a0,(SP *)pbrtObject);
        std::vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
        ::emplace_back<std::shared_ptr<pbrt::Instance>>
                  ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                    *)&(peVar6->sampler).
                       super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (shared_ptr<pbrt::Instance> *)local_a0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        }
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        psVar13 = psVar13 + 2;
      } while (psVar13 != psVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"created object w/ ",0x12);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," shapes, ",9);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," instances, and ",0x10);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," light sources",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  else {
    pmVar7 = std::
             map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
             ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                           *)(pbrtObject + 0xe),(key_type *)in_RDX);
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pmVar7->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (pmVar7->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  SVar15.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  SVar15.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar15.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP SemanticParser::findOrEmitObject(pbrt::syntactic::Object::SP pbrtObject)
  {
    if (emittedObjects.find(pbrtObject) != emittedObjects.end()) {
      return emittedObjects[pbrtObject];
    }
      
    Object::SP ourObject = std::make_shared<Object>();
    emittedObjects[pbrtObject] = ourObject;
    ourObject->name = pbrtObject->name;
    
    for (auto lightSource : pbrtObject->lightSources) {
      LightSource::SP ourLightSource = findOrCreateLightSource(lightSource);
      if (ourLightSource)
        ourObject->lightSources.push_back(ourLightSource);
      else
        std::cout << "***warning***: could ont parse light source '" << lightSource->toString() << "'"
                  << std::endl;
    }

    for (auto shape : pbrtObject->shapes) {
      Shape::SP ourShape = findOrCreateShape(shape);
      if (ourShape)
        ourObject->shapes.push_back(ourShape);
    }
    
    for (auto instance : pbrtObject->objectInstances)
      ourObject->instances.push_back(emitInstance(instance));

    std::cout << "created object w/ " << ourObject->shapes.size() << " shapes, "
              << ourObject->instances.size() << " instances, and "
              << ourObject->lightSources.size() << " light sources" << std::endl;
    return ourObject;
  }